

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

IDiagObjectAddress * __thiscall
Js::RecyclableObjectWalker::FindPropertyAddress
          (RecyclableObjectWalker *this,PropertyId propertyId,bool *isConst)

{
  Type pDVar1;
  bool bVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  Type *ppDVar7;
  ArenaAllocator *alloc;
  Type *ppIVar8;
  RecyclableObjectAddress *pRVar9;
  undefined4 extraout_var_00;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  RecyclableObjectAddress *unaff_R12;
  int iVar10;
  undefined4 extraout_var;
  
  (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])();
  if (this->pMembersList !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    this_00 = this->pMembersList;
    iVar10 = (this_00->
             super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
             ).count;
    bVar2 = 0 < iVar10;
    if (0 < iVar10) {
      iVar10 = 0;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        ppDVar7 = JsUtil::
                  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this_00,iVar10);
        pDVar1 = *ppDVar7;
        if (pDVar1 == (Type)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x93f,"(pair)","pair");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        if (pDVar1->propId == propertyId) {
          *isConst = (bool)((byte)pDVar1->flags & 1);
          alloc = GetArenaFromContext(this->scriptContext);
          unaff_R12 = (RecyclableObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
          RecyclableObjectAddress::RecyclableObjectAddress
                    (unaff_R12,this->instance,propertyId,pDVar1->aVar,pDVar1->flags >> 1 & 1);
          break;
        }
        iVar10 = iVar10 + 1;
        this_00 = this->pMembersList;
        iVar5 = (this_00->
                super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        bVar2 = iVar10 < iVar5;
      } while (iVar10 < iVar5);
    }
    if (bVar2) {
      return &unaff_R12->super_IDiagObjectAddress;
    }
  }
  if (this->fakeGroupObjectWalkerList !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    iVar10 = (this->fakeGroupObjectWalkerList->
             super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
             ).count;
    bVar2 = 0 < iVar10;
    pRVar9 = unaff_R12;
    if (0 < iVar10) {
      ppIVar8 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->fakeGroupObjectWalkerList,0);
      iVar10 = (*(*ppIVar8)->_vptr_IDiagObjectModelWalkerBase[3])
                         (*ppIVar8,(ulong)(uint)propertyId,isConst);
      pRVar9 = (RecyclableObjectAddress *)CONCAT44(extraout_var,iVar10);
      if (pRVar9 == (RecyclableObjectAddress *)0x0) {
        iVar10 = 1;
        do {
          iVar5 = (this->fakeGroupObjectWalkerList->
                  super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
          bVar2 = iVar10 < iVar5;
          pRVar9 = unaff_R12;
          if (iVar5 <= iVar10) break;
          ppIVar8 = JsUtil::
                    List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this->fakeGroupObjectWalkerList,iVar10);
          iVar5 = (*(*ppIVar8)->_vptr_IDiagObjectModelWalkerBase[3])
                            (*ppIVar8,(ulong)(uint)propertyId,isConst);
          pRVar9 = (RecyclableObjectAddress *)CONCAT44(extraout_var_00,iVar5);
          iVar10 = iVar10 + 1;
        } while (pRVar9 == (RecyclableObjectAddress *)0x0);
      }
    }
    if (bVar2) {
      return &pRVar9->super_IDiagObjectAddress;
    }
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress *RecyclableObjectWalker::FindPropertyAddress(PropertyId propertyId, bool& isConst)
    {
        GetChildrenCount(); // Ensure to populate members

        if (pMembersList != nullptr)
        {
            for (int i = 0; i < pMembersList->Count(); i++)
            {
                DebuggerPropertyDisplayInfo *pair = pMembersList->Item(i);
                Assert(pair);
                if (pair->propId == propertyId)
                {
                    isConst = pair->IsConst();
                    return Anew(GetArenaFromContext(scriptContext),
                        RecyclableObjectAddress,
                        instance,
                        propertyId,
                        pair->aVar,
                        pair->IsInDeadZone() ? TRUE : FALSE);
                }
            }
        }

        // Following is for "with object" scope lookup. We may have members in [Methods] group or prototype chain that need to
        // be exposed to expression evaluation.
        if (fakeGroupObjectWalkerList != nullptr)
        {
            // WARNING: Following depends on [Methods] group being before [prototype] group. We need to check local [Methods] group
            // first for local properties before going to prototype chain.
            for (int i = 0; i < fakeGroupObjectWalkerList->Count(); i++)
            {
                IDiagObjectAddress* address = fakeGroupObjectWalkerList->Item(i)->FindPropertyAddress(propertyId, isConst);
                if (address != nullptr)
                {
                    return address;
                }
            }
        }

        return nullptr;
    }